

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::Start
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aExistingCommissionerId,
          string *aBorderAgentAddr,uint16_t aBorderAgentPort)

{
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::Start(std::string       &aExistingCommissionerId,
                             const std::string &aBorderAgentAddr,
                             uint16_t           aBorderAgentPort)
{
    UNUSED(aExistingCommissionerId);
    UNUSED(aBorderAgentAddr);
    UNUSED(aBorderAgentPort);
    return Error{};
}